

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::swizzle(ImageT<unsigned_char,_1U> *this,string_view swizzle)

{
  Color *pCVar1;
  Color CVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ulong uVar6;
  Color srcPixel;
  undefined8 uStack_38;
  
  if (swizzle._M_len == 4) {
    if ((this->super_Image).height * (this->super_Image).width != 0) {
      uVar5 = 0;
      uStack_38 = in_RAX;
      do {
        uStack_38 = CONCAT17(this->pixels[uVar5].field_0.comps[0],(undefined7)uStack_38);
        iVar3 = (*(this->super_Image)._vptr_Image[5])(this);
        if (iVar3 != 0) {
          uVar6 = 0;
          do {
            pCVar1 = this->pixels;
            CVar2.field_0 =
                 (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
                 swizzlePixel(this,(Color *)((long)&uStack_38 + 7),swizzle._M_str[uVar6]);
            pCVar1[uVar5].field_0 = CVar2.field_0;
            uVar6 = uVar6 + 1;
            uVar4 = (*(this->super_Image)._vptr_Image[5])(this);
          } while (uVar6 < uVar4);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->super_Image).height * (this->super_Image).width);
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned char, 1>::swizzle(std::string_view) [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }